

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O3

void __thiscall fp::Algorithm::DFSAlgorithm(Algorithm *this,shared_ptr<fp::LandBasedRobot> *robot)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ostream *this_00;
  long *plVar4;
  _Elt_pointer paVar5;
  long lVar6;
  array<int,_2UL> curr_node_00;
  char *pcVar7;
  array<int,_2UL> curr_node;
  array<int,_2UL> local_48;
  array<int,_2UL> local_40;
  array<std::array<fp::Node,_16UL>,_16UL> *local_38;
  
  (this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  iVar1 = (**((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_LandBasedRobot)();
  iVar2 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x15])();
  local_40._M_elems[0] = iVar2;
  iVar3 = (*((robot->super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_LandBasedRobot[0x16])();
  local_40._M_elems[1] = iVar3;
  curr_node_00._M_elems = local_40._M_elems;
  local_38 = &this->node_master_;
  *&(this->node_master_)._M_elems[iVar2]._M_elems[iVar3].parent_node_._M_elems = local_40._M_elems;
  SetDefaults(this);
  do {
    Maze::ReadMaze(&this->maze_info,curr_node_00,(char)iVar1);
    FindNeighbours(this,curr_node_00,(char)iVar1);
    iVar1 = curr_node_00._M_elems[0];
    iVar2 = curr_node_00._M_elems[1];
    paVar5 = local_38->_M_elems[iVar1]._M_elems[iVar2].child_node_.c.
             super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>._M_impl
             .super__Deque_impl_data._M_finish._M_cur;
    if (paVar5 == local_38->_M_elems[iVar1]._M_elems[iVar2].child_node_.c.
                  super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                  _M_impl.super__Deque_impl_data._M_start._M_cur) {
      curr_node_00._M_elems = *&local_38->_M_elems[iVar1]._M_elems[iVar2].parent_node_._M_elems;
      lVar6 = 0x15;
      pcVar7 = "Next is Parent Node: ";
      local_48._M_elems = curr_node_00._M_elems;
    }
    else {
      if (paVar5 == local_38->_M_elems[iVar1]._M_elems[iVar2].child_node_.c.
                    super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first) {
        paVar5 = local_38->_M_elems[iVar1]._M_elems[iVar2].child_node_.c.
                 super__Deque_base<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      curr_node_00._M_elems = *&paVar5[-1]._M_elems;
      local_48._M_elems = curr_node_00._M_elems;
      std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>::pop_back
                (&local_38->_M_elems[iVar1]._M_elems[iVar2].child_node_.c);
      lVar6 = 0xc;
      pcVar7 = "Child Node: ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar6);
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,curr_node_00._M_elems[0]);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
    plVar4 = (long *)std::ostream::operator<<(this_00,curr_node_00._M_elems[1]);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    Navigate(this,&local_40,&local_48);
    iVar1 = (**((this->robot_).super___shared_ptr<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->_vptr_LandBasedRobot)();
    local_40._M_elems = curr_node_00._M_elems;
  } while ((((curr_node_00._M_elems != *&(this->goal1_)._M_elems) &&
            (curr_node_00._M_elems != *&(this->goal2_)._M_elems)) &&
           (curr_node_00._M_elems != *&(this->goal3_)._M_elems)) &&
          (curr_node_00._M_elems != *&(this->goal4_)._M_elems));
  SetDefaults(this);
  *&(this->end_goal_)._M_elems = curr_node_00._M_elems;
  API::setColor(curr_node_00._M_elems[1],0xf - curr_node_00._M_elems[0],'r');
  return;
}

Assistant:

void fp::Algorithm::DFSAlgorithm(const std::shared_ptr<fp::LandBasedRobot> &robot) {
    this->robot_ = robot;
    char curr_direction{robot->GetDirection()};
    std::array<int, 2> curr_node{robot->get_x_(), robot->get_y_()};
    std::array<int, 2> next_node{};
    this->node_master_[curr_node[0]][curr_node[1]].parent_node_ = curr_node;

    //---> Step 01: Clear all tile color <---//
    SetDefaults();
    while (true) {
        //---> Step 02: Read walls around the robot <---//
        this->maze_info.ReadMaze(curr_node, curr_direction);
        FindNeighbours(curr_node, curr_direction);
        if (!this->node_master_[curr_node[0]][curr_node[1]].child_node_.empty()) {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].child_node_.top();
            this->node_master_[curr_node[0]][curr_node[1]].child_node_.pop();
            std::cerr << "Child Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        } else {
            next_node = this->node_master_[curr_node[0]][curr_node[1]].parent_node_;
            std::cerr << "Next is Parent Node: " << next_node[0] << ", " << next_node[1] << std::endl;
        }
        this->Navigate(curr_node, next_node);


        //---> Step 06: Get robot current cell info <---//
        curr_direction = this->robot_->GetDirection();
        curr_node = next_node;

        //---> Step 07: Check for goal <---//
        if (curr_node == this->goal1_ || curr_node == this->goal2_ ||
            curr_node == this->goal3_ || curr_node == this->goal4_) {
            SetDefaults();
            this->end_goal_ = curr_node;
            fp::API::setColor(curr_node[1], 15 - curr_node[0], 'r');
            return;
        }
    }
    std::cerr << "\nNo path found!\n" << std::endl;
}